

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O1

bool duckdb::ValueOperations::DistinctGreaterThanEquals(Value *left,Value *right)

{
  bool bVar1;
  
  if (((right->is_null != true) || (bVar1 = true, left->is_null == false)) &&
     (bVar1 = left->is_null, right->is_null == false && bVar1 == false)) {
    bVar1 = TemplatedBooleanOperation<duckdb::GreaterThan>(right,left);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool ValueOperations::DistinctGreaterThanEquals(const Value &left, const Value &right) {
	return !ValueOperations::DistinctGreaterThan(right, left);
}